

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall
embree::ImageT<embree::Col4<unsigned_char>_>::ImageT
          (ImageT<embree::Col4<unsigned_char>_> *this,size_t width,size_t height,
          Col4<unsigned_char> *color,bool copy,string *name,bool flip_y)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  void *pvVar5;
  undefined1 *puVar6;
  long in_RCX;
  undefined1 *puVar7;
  ulong in_RDX;
  ulong in_RSI;
  undefined8 *in_RDI;
  byte in_R8B;
  byte in_stack_00000008;
  size_t i;
  size_t x;
  size_t y;
  Col4<unsigned_char> *out;
  Col4<unsigned_char> *in;
  string *in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff38;
  Image *in_stack_ffffffffffffff40;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  long local_80;
  long local_78;
  
  Image::Image(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28);
  *in_RDI = &PTR__ImageT_00607688;
  if ((in_R8B & 1) == 0) {
    in_RDI[8] = in_RCX;
  }
  else {
    uVar2 = in_RSI * in_RDX;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    if (uVar2 != 0) {
      pvVar5 = pvVar4;
      do {
        pvVar5 = (void *)((long)pvVar5 + 4);
      } while (pvVar5 != (void *)((long)pvVar4 + uVar2 * 4));
    }
    in_RDI[8] = pvVar4;
    if ((in_stack_00000008 & 1) == 0) {
      for (local_98 = 0; local_98 < in_RSI * in_RDX; local_98 = local_98 + 1) {
        puVar6 = (undefined1 *)(in_RCX + local_98 * 4);
        puVar7 = (undefined1 *)(in_RDI[8] + local_98 * 4);
        *puVar7 = *puVar6;
        puVar7[1] = puVar6[1];
        puVar7[2] = puVar6[2];
        puVar7[3] = puVar6[3];
      }
    }
    else {
      local_78 = in_RCX + (in_RDX - 1) * in_RSI * 4;
      local_80 = in_RDI[8];
      for (local_88 = 0; local_88 < in_RDX; local_88 = local_88 + 1) {
        for (local_90 = 0; local_90 < in_RSI; local_90 = local_90 + 1) {
          puVar6 = (undefined1 *)(local_78 + local_90 * 4);
          puVar7 = (undefined1 *)(local_80 + local_90 * 4);
          *puVar7 = *puVar6;
          puVar7[1] = puVar6[1];
          puVar7[2] = puVar6[2];
          puVar7[3] = puVar6[3];
        }
        local_78 = local_78 + in_RSI * -4;
        local_80 = in_RSI * 4 + local_80;
      }
    }
  }
  return;
}

Assistant:

ImageT (size_t width, size_t height, T* color, const bool copy = true, const std::string& name = "", const bool flip_y = false)
      : Image(width,height,name)
    {
      if (copy)
      {
        data = new T[width*height];

        if (flip_y)
        {
          const T* in = color + (height-1) * width;
          T* out = data;

          for (size_t y=0; y<height; y++)
          {
            for (size_t x=0; x<width; x++)
              out[x] = in[x];

            in -= width;
            out += width;
          }
        }
        else
        {
          for (size_t i=0; i<width*height; i++)
            data[i] = color[i];
        }
      } 
      else
      {
        data = color;
      }
    }